

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_decompress(uchar *output,uchar *i,uint length)

{
  uint buflen;
  uint uVar1;
  byte *pbVar2;
  uint in_EDX;
  byte *in_RSI;
  uchar *in_RDI;
  uchar *old_i;
  uint olen;
  byte *local_18;
  
  if (((uint)*in_RSI * 0x1000000 +
       (uint)in_RSI[1] * 0x10000 + (uint)in_RSI[2] * 0x100 + (uint)in_RSI[3] == 0x57bc0000) &&
     ((uint)in_RSI[4] * 0x1000000 +
      (uint)in_RSI[5] * 0x10000 + (uint)in_RSI[6] * 0x100 + (uint)in_RSI[7] == 0)) {
    buflen = nk_decompress_length(in_RSI);
    nk__barrier3 = in_RSI + in_EDX;
    nk__barrier = in_RDI + buflen;
    nk__barrier2 = in_RSI;
    nk__barrier4 = in_RDI;
    nk__dout = in_RDI;
    local_18 = in_RSI + 0x10;
    do {
      pbVar2 = nk_decompress_token((uchar *)0x120736);
      if (pbVar2 == local_18) {
        if ((*pbVar2 != 5) || (pbVar2[1] != 0xfa)) {
          return 0;
        }
        if (nk__dout != in_RDI + buflen) {
          return 0;
        }
        uVar1 = nk_adler32(1,in_RDI,buflen);
        if (uVar1 != (uint)pbVar2[2] * 0x1000000 +
                     (uint)pbVar2[3] * 0x10000 + (uint)pbVar2[4] * 0x100 + (uint)pbVar2[5]) {
          return 0;
        }
        return buflen;
      }
      local_18 = pbVar2;
    } while (nk__dout <= in_RDI + buflen);
  }
  return 0;
}

Assistant:

NK_INTERN unsigned int
nk_decompress(unsigned char *output, unsigned char *i, unsigned int length)
{
unsigned int olen;
if (nk__in4(0) != 0x57bC0000) return 0;
if (nk__in4(4) != 0)          return 0; /* error! stream is > 4GB */
olen = nk_decompress_length(i);
nk__barrier2 = i;
nk__barrier3 = i+length;
nk__barrier = output + olen;
nk__barrier4 = output;
i += 16;

nk__dout = output;
for (;;) {
unsigned char *old_i = i;
i = nk_decompress_token(i);
if (i == old_i) {
if (*i == 0x05 && i[1] == 0xfa) {
NK_ASSERT(nk__dout == output + olen);
if (nk__dout != output + olen) return 0;
if (nk_adler32(1, output, olen) != (unsigned int) nk__in4(2))
return 0;
return olen;
} else {
NK_ASSERT(0); /* NOTREACHED */
return 0;
}
}
NK_ASSERT(nk__dout <= output + olen);
if (nk__dout > output + olen)
return 0;
}
}